

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Liby::Connection::sync_send(Connection *this,Buffer *buffer)

{
  element_type *peVar1;
  bool bVar2;
  char *__buf;
  size_t __n;
  ssize_t sVar3;
  uint uVar4;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  Socket::setNoblock((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,false);
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_invoke;
  local_48._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  do {
    bVar2 = Buffer::empty(buffer);
    if (bVar2) break;
    peVar1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __buf = Buffer::data(buffer);
    __n = Buffer::size(buffer);
    sVar3 = write(peVar1->fd_,__buf,__n);
    uVar4 = (uint)sVar3;
    if ((int)uVar4 < 1) break;
    Buffer::retrieve(buffer,(ulong)(uVar4 & 0x7fffffff));
  } while (0 < (int)uVar4);
  DeferCaller::~DeferCaller((DeferCaller *)&local_48);
  return;
}

Assistant:

void Connection::sync_send(Buffer &buffer) {
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    while (!buffer.empty()) {
        int nbytes =
            socket_->write(static_cast<void *>(buffer.data()), buffer.size());
        if (nbytes > 0) {
            buffer.retrieve(nbytes);
        } else {
            break;
        }
    }
}